

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

bool __thiscall
capnp::InterfaceSchema::extends(InterfaceSchema *this,InterfaceSchema other,uint *counter)

{
  bool bVar1;
  uint64_t id;
  unsigned_long i;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  Schema local_d0;
  Reader superclasses;
  Fault f;
  Reader local_60;
  
  superclasses.reader.segment._0_4_ = *counter;
  *counter = (uint)superclasses.reader.segment + 1;
  superclasses.reader.capTable = (CapTableReader *)&MAX_SUPERCLASSES;
  superclasses.reader.ptr = " < ";
  superclasses.reader.elementCount = 4;
  superclasses.reader.step = 0;
  superclasses.reader.structDataSize._0_1_ = (uint)superclasses.reader.segment < 0x40;
  if ((bool)(undefined1)superclasses.reader.structDataSize) {
    if ((Schema)(this->super_Schema).raw == other.super_Schema.raw) {
      bVar1 = true;
    }
    else {
      Schema::getProto(&local_60,&this->super_Schema);
      f.exception = (Exception *)local_60._reader.segment;
      capnp::schema::Node::Interface::Reader::getSuperclasses(&superclasses,(Reader *)&f);
      uVar3 = superclasses.reader._24_8_ & 0xffffffff;
      uVar2 = 0;
      do {
        bVar4 = uVar3 == uVar2;
        bVar1 = !bVar4;
        if (bVar4) {
          return bVar1;
        }
        _::ListReader::getStructElement((StructReader *)&f,&superclasses.reader,(ElementCount)uVar2)
        ;
        if (local_60._reader.dataSize < 0x40) {
          id = 0;
        }
        else {
          id = *local_60._reader.data;
        }
        local_d0 = Schema::getDependency(&this->super_Schema,id,(ElementCount)uVar2 | 0x4000000);
        local_60._reader.segment = (SegmentReader *)Schema::asInterface(&local_d0);
        bVar4 = extends((InterfaceSchema *)&local_60,other,counter);
        uVar2 = uVar2 + 1;
      } while (!bVar4);
    }
  }
  else {
    bVar1 = false;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x27f,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)&superclasses,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    kj::_::Debug::Fault::~Fault(&f);
  }
  return bVar1;
}

Assistant:

bool InterfaceSchema::extends(InterfaceSchema other, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return false;
  }

  if (other == *this) {
    return true;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    if (getDependency(superclass.getId(), location).asInterface().extends(other, counter)) {
      return true;
    }
  }

  return false;
}